

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

void __thiscall asmjit::BaseBuilder::removeNodes(BaseBuilder *this,BaseNode *first,BaseNode *last)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  BaseNode *pBVar3;
  BaseNode *pBVar4;
  bool bVar5;
  BaseNode *pBVar6;
  BaseNode **ppBVar7;
  bool bVar8;
  
  if (first == last) {
    removeNode(this,first);
    return;
  }
  if ((char)(first->field_1)._any._nodeFlags < '\0') {
    pBVar3 = (first->field_0).field_0._prev;
    pBVar4 = (last->field_0).field_0._next;
    ppBVar7 = &(pBVar3->field_0).field_0._next;
    if (this->_firstNode == first) {
      ppBVar7 = &this->_firstNode;
    }
    *ppBVar7 = pBVar4;
    pBVar6 = (BaseNode *)&this->_lastNode;
    if (this->_lastNode != last) {
      pBVar6 = pBVar4;
    }
    (pBVar6->field_0).field_0._prev = pBVar3;
    bVar5 = false;
    do {
      pBVar4 = (first->field_0).field_0._next;
      if (pBVar4 == (BaseNode *)0x0) {
        removeNodes();
        this->_cursor = first;
        return;
      }
      (first->field_0).field_0._prev = (BaseNode *)0x0;
      (first->field_0).field_0._next = (BaseNode *)0x0;
      puVar1 = &(first->field_1)._any._nodeFlags;
      *puVar1 = *puVar1 & 0x7f;
      uVar2 = (first->field_1)._any._nodeType;
      if (this->_cursor == first) {
        this->_cursor = pBVar3;
      }
      bVar5 = (bool)(bVar5 | uVar2 == '\x02');
      bVar8 = first != last;
      first = pBVar4;
    } while (bVar8);
    if (bVar5) {
      this->_dirtySectionLinks = true;
    }
  }
  return;
}

Assistant:

void BaseBuilder::removeNodes(BaseNode* first, BaseNode* last) noexcept {
  if (first == last) {
    removeNode(first);
    return;
  }

  if (!first->isActive())
    return;

  BaseNode* prev = first->prev();
  BaseNode* next = last->next();

  if (_firstNode == first)
    _firstNode = next;
  else
    prev->_next = next;

  if (_lastNode == last)
    _lastNode  = prev;
  else
    next->_prev = prev;

  BaseNode* node = first;
  uint32_t didRemoveSection = false;

  for (;;) {
    next = node->next();
    ASMJIT_ASSERT(next != nullptr);

    node->_prev = nullptr;
    node->_next = nullptr;
    node->clearFlags(BaseNode::kFlagIsActive);
    didRemoveSection |= uint32_t(node->isSection());

    if (_cursor == node)
      _cursor = prev;

    if (node == last)
      break;
    node = next;
  }

  if (didRemoveSection)
    _dirtySectionLinks = true;
}